

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Vec3fa embree::cartesian(float phi,float sinTheta,float cosTheta)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float in_XMM1_Da;
  uint in_XMM2_Da;
  Vec3fa VVar4;
  float cosPhi;
  float sinPhi;
  
  fVar2 = sinf(in_XMM0_Da);
  fVar3 = cosf(in_XMM0_Da);
  uVar1 = CONCAT44(fVar2 * in_XMM1_Da,fVar3 * in_XMM1_Da);
  *in_RDI = uVar1;
  in_RDI[1] = (ulong)in_XMM2_Da;
  VVar4.field_0.m128[2] = (float)in_XMM2_Da;
  VVar4.field_0._0_8_ = uVar1;
  VVar4.field_0.m128[3] = 0.0;
  return (Vec3fa)VVar4.field_0;
}

Assistant:

inline Vec3fa cartesian(const float phi, const float sinTheta, const float cosTheta)
{
  const float sinPhi = sinf(phi);
  const float cosPhi = cosf(phi);
  //sincosf(phi, &sinPhi, &cosPhi);
  return Vec3fa(cosPhi * sinTheta,
                    sinPhi * sinTheta,
                    cosTheta);
}